

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZElementMatrixT.cpp
# Opt level: O1

void __thiscall
TPZElementMatrixT<std::complex<double>_>::ApplyOneShapeConstraints
          (TPZElementMatrixT<std::complex<double>_> *this,int constraintindex)

{
  list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *plVar1;
  complex<double> *pcVar2;
  double *pdVar3;
  double *pdVar4;
  undefined8 *puVar5;
  int iVar6;
  _List_node_base *p_Var7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  complex<double> *pcVar11;
  complex<double> *pcVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  _List_node_base *p_Var24;
  long lVar25;
  long lVar26;
  
  p_Var24 = (this->super_TPZElementMatrix).fOneRestraints.
            super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>._M_impl.
            _M_node.super__List_node_base._M_next;
  plVar1 = &(this->super_TPZElementMatrix).fOneRestraints;
  if (p_Var24 != (_List_node_base *)plVar1) {
    p_Var7 = (_List_node_base *)
             (this->super_TPZElementMatrix).fConstrConnect.super_TPZManVector<long,_10>.
             super_TPZVec<long>.fStore[constraintindex];
    iVar6 = (this->fConstrBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[constraintindex].pos;
    lVar8 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
            super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
    lVar9 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
            super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol;
    do {
      if ((p_Var24[1]._M_prev)->_M_next == p_Var7) {
        lVar22 = (long)*(int *)&(p_Var24[1]._M_prev)->_M_prev + (long)iVar6;
        lVar25 = 1;
        do {
          uVar10 = (this->super_TPZElementMatrix).fConstrConnect.super_TPZManVector<long,_10>.
                   super_TPZVec<long>.fNElements;
          if ((long)uVar10 < 1) {
            uVar20 = 0;
            uVar21 = 0;
          }
          else {
            uVar20 = 0;
            do {
              uVar21 = uVar20;
              if ((_List_node_base *)
                  (this->super_TPZElementMatrix).fConstrConnect.super_TPZManVector<long,_10>.
                  super_TPZVec<long>.fStore[uVar20] == p_Var24[1]._M_prev[lVar25]._M_next) break;
              uVar20 = uVar20 + 1;
              uVar21 = uVar10;
            } while (uVar10 != uVar20);
            uVar20 = uVar21 & 0xffffffff;
          }
          if (uVar10 == uVar21) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZElementMatrixT.cpp"
                       ,0x178);
          }
          lVar26 = (long)*(int *)&p_Var24[1]._M_prev[lVar25]._M_prev +
                   (long)(this->fConstrBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[uVar20].
                         pos;
          dVar16 = (double)-(*(int *)((long)&(p_Var24[7]._M_prev)->_M_next + lVar25 * 4) /
                            *(int *)&(p_Var24[7]._M_prev)->_M_next);
          if ((this->super_TPZElementMatrix).fType == EK) {
            if (0 < lVar8) {
              lVar23 = 0;
              do {
                if (((lVar22 < 0) ||
                    ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                     super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow <= lVar22)) ||
                   ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                    super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar23)) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar18 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                         super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
                pcVar12 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem +
                          lVar18 * lVar23 + lVar22;
                if (((lVar26 < 0) || (lVar18 <= lVar26)) ||
                   ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                    super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar23)) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar18 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                         super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow * lVar23;
                pcVar11 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem;
                pcVar2 = pcVar11 + lVar18 + lVar26;
                dVar17 = *(double *)(pcVar2->_M_value + 8) +
                         *(double *)(pcVar12->_M_value + 8) * dVar16;
                auVar13._8_4_ = SUB84(dVar17,0);
                auVar13._0_8_ = *(double *)pcVar2->_M_value + *(double *)pcVar12->_M_value * dVar16;
                auVar13._12_4_ = (int)((ulong)dVar17 >> 0x20);
                *(undefined1 (*) [16])pcVar11[lVar18 + lVar26]._M_value = auVar13;
                lVar23 = lVar23 + 1;
              } while (lVar8 != lVar23);
            }
          }
          else if (0 < lVar9) {
            lVar23 = 0;
            do {
              if (((lVar22 < 0) ||
                  ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                   super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow <= lVar22)) ||
                 ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                  super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar23)) {
                TPZFMatrix<std::complex<double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar18 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                       super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
              pcVar12 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem +
                        lVar18 * lVar23 + lVar22;
              if (((lVar26 < 0) || (lVar18 <= lVar26)) ||
                 ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                  super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar23)) {
                TPZFMatrix<std::complex<double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar18 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                       super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow * lVar23;
              pcVar11 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem;
              pcVar2 = pcVar11 + lVar18 + lVar26;
              dVar17 = *(double *)(pcVar2->_M_value + 8) +
                       *(double *)(pcVar12->_M_value + 8) * dVar16;
              auVar15._8_4_ = SUB84(dVar17,0);
              auVar15._0_8_ = *(double *)pcVar2->_M_value + *(double *)pcVar12->_M_value * dVar16;
              auVar15._12_4_ = (int)((ulong)dVar17 >> 0x20);
              *(undefined1 (*) [16])pcVar11[lVar18 + lVar26]._M_value = auVar15;
              lVar23 = lVar23 + 1;
            } while (lVar9 != lVar23);
          }
          if ((this->super_TPZElementMatrix).fType == EK && 0 < lVar8) {
            lVar23 = 0;
            lVar18 = 0;
            do {
              if ((((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                    super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow <= lVar18) ||
                  (lVar22 < 0)) ||
                 ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                  super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar22)) {
                TPZFMatrix<std::complex<double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar19 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                       super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
              pdVar3 = (double *)
                       ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem
                        [lVar19 * lVar22]._M_value + lVar23);
              if (((lVar19 <= lVar18) || (lVar26 < 0)) ||
                 ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                  super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar26)) {
                TPZFMatrix<std::complex<double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar19 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                       super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow * lVar26;
              pcVar12 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem;
              pdVar4 = (double *)(pcVar12[lVar19]._M_value + lVar23);
              dVar17 = pdVar4[1] + pdVar3[1] * dVar16;
              auVar14._8_4_ = SUB84(dVar17,0);
              auVar14._0_8_ = *pdVar4 + *pdVar3 * dVar16;
              auVar14._12_4_ = (int)((ulong)dVar17 >> 0x20);
              *(undefined1 (*) [16])(pcVar12[lVar19]._M_value + lVar23) = auVar14;
              lVar18 = lVar18 + 1;
              lVar23 = lVar23 + 0x10;
            } while (lVar8 != lVar18);
          }
          lVar25 = lVar25 + 1;
        } while (lVar25 != 4);
        if ((this->super_TPZElementMatrix).fType == EK) {
          if (0 < lVar8) {
            lVar26 = 0;
            lVar25 = 0;
            do {
              if ((((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                    super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow <= lVar25) ||
                  (lVar22 < 0)) ||
                 ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                  super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar22)) {
                TPZFMatrix<std::complex<double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              puVar5 = (undefined8 *)
                       ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem
                        [(this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                         super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow * lVar22].
                        _M_value + lVar26);
              *puVar5 = 0;
              puVar5[1] = 0;
              if (((lVar22 < 0) ||
                  ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                   super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow <= lVar22)) ||
                 ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                  super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar25)) {
                TPZFMatrix<std::complex<double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar23 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                       super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow * lVar25;
              lVar25 = lVar25 + 1;
              pcVar12 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem +
                        lVar23 + lVar22;
              *(undefined8 *)pcVar12->_M_value = 0;
              *(undefined8 *)(pcVar12->_M_value + 8) = 0;
              lVar26 = lVar26 + 0x10;
            } while (lVar8 != lVar25);
          }
          if (((lVar22 < 0) ||
              ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
               super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow <= lVar22)) ||
             ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
              super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar22)) {
            TPZFMatrix<std::complex<double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar12 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem +
                    lVar22 * (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                             super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow +
                    lVar22;
          *(undefined8 *)pcVar12->_M_value = 0x3ff0000000000000;
          *(undefined8 *)(pcVar12->_M_value + 8) = 0;
        }
        else if (0 < lVar9) {
          lVar25 = 0;
          do {
            if (((lVar22 < 0) ||
                ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                 super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow <= lVar22)) ||
               ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar25)) {
              TPZFMatrix<std::complex<double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar26 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                     super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow * lVar25;
            lVar25 = lVar25 + 1;
            pcVar12 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem +
                      lVar26 + lVar22;
            *(undefined8 *)pcVar12->_M_value = 0;
            *(undefined8 *)(pcVar12->_M_value + 8) = 0;
          } while (lVar9 != lVar25);
        }
      }
      p_Var24 = p_Var24->_M_next;
    } while (p_Var24 != (_List_node_base *)plVar1);
  }
  return;
}

Assistant:

void TPZElementMatrixT<TVar>::ApplyOneShapeConstraints(int constraintindex)
{
    int64_t dfnindex = this->fConstrConnect[constraintindex];


#ifdef PZ_LOG
    int count = 0;
    for (std::list<TPZOneShapeRestraint>::iterator it = fOneRestraints.begin(); it != fOneRestraints.end(); it++) {
        if (it->fFaces[0].first != dfnindex) {
            continue;
        }
        count++;
    }
    if (count && logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "Element matrix before ApplyOneShapeConstraint\n";
        fConstrMat.Print("EKBefore = ",sout,EMathematicaInput);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    int64_t inpos = this->fConstrBlock.Position(constraintindex);
    int64_t toteq = this->fConstrMat.Rows();
    int64_t nrhs = this->fConstrMat.Cols();

    for (std::list<TPZOneShapeRestraint>::iterator it = fOneRestraints.begin(); it != fOneRestraints.end(); it++) {
        if (it->fFaces[0].first != dfnindex) {
            continue;
        }
        int64_t send = inpos+it->fFaces[0].second;
        for (int id=1; id<4; id++) {
            int64_t depindex = it->fFaces[id].first;
            int locdep = 0;
            for (locdep = 0; locdep < fConstrConnect.size(); locdep++) {
                if (fConstrConnect[locdep] == depindex) {
                    break;
                }
            }
            if (locdep == fConstrConnect.size()) {
                DebugStop();
            }
            int64_t deppos = this->fConstrBlock.Position(locdep);
            int64_t receive = deppos+it->fFaces[id].second;
            REAL coef = -it->fOrient[id]/it->fOrient[0];
            if (this->fType == TPZElementMatrix::EK){
                for(int ieq=0; ieq<toteq; ieq++) {
                    (this->fConstrMat)(receive,ieq) += coef*(this->fConstrMat)(send,ieq);
                }
            }//EK
            else
            {
                
                for(int ieq=0; ieq<nrhs; ieq++) {
                    (this->fConstrMat)(receive,ieq) += coef*(this->fConstrMat)(send,ieq);
                }
            }//EF

            if (this->fType == TPZElementMatrix::EK){
                for(int ieq=0; ieq<toteq; ieq++)
                {
                    (this->fConstrMat)(ieq,receive) += coef*(this->fConstrMat)(ieq,send);
                }
            }//EK

        }
        if (this->fType == TPZElementMatrix::EK){
            for(int ieq=0; ieq<toteq; ieq++)
            {
                (this->fConstrMat)(ieq,send) = 0.;
                (this->fConstrMat)(send,ieq) = 0.;
            }
            (this->fConstrMat)(send,send) = 1.;
        }//EK
        else
        {
            for(int ieq=0; ieq<nrhs; ieq++) {
                (this->fConstrMat)(send,ieq) = 0.;
            }
        }

    }
#ifdef PZ_LOG
    if (count && logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "Element matrix after ApplyOneShapeConstraint\n";
        fConstrMat.Print("EKAfter = ",sout,EMathematicaInput);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
}